

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

void __thiscall rw::Frame::destroyHierarchy(Frame *this)

{
  Frame *pFVar1;
  Frame *local_20;
  Frame *child;
  Frame *next;
  Frame *this_local;
  
  local_20 = this->child;
  while (local_20 != (Frame *)0x0) {
    pFVar1 = local_20->next;
    destroyHierarchy(local_20);
    local_20 = pFVar1;
  }
  pFVar1 = this;
  PluginList::destruct((PluginList *)&s_plglist,this);
  if (((this->object).privateFlags & 3) != 0) {
    LLLink::remove(&this->inDirtyList,(char *)pFVar1);
  }
  (*DAT_00168638)(this);
  return;
}

Assistant:

void
Frame::destroyHierarchy(void)
{
	Frame *next;
	for(Frame *child = this->child; child; child = next){
		next = child->next;
		child->destroyHierarchy();
	}
	assert(this->objectList.isEmpty());
	s_plglist.destruct(this);
	if(this->object.privateFlags & Frame::HIERARCHYSYNC)
		this->inDirtyList.remove();
	rwFree(this);
}